

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::ForNode(CConnman *this,NodeId id,function<bool_(CNode_*)> func)

{
  CNode *__args;
  bool bVar1;
  pointer ppCVar2;
  function<bool_(CNode_*)> *in_RDX;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&this->m_nodes_mutex,
             "m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xf30,false);
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppCVar2 ==
        (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0018401f;
    __args = *ppCVar2;
    ppCVar2 = ppCVar2 + 1;
  } while (__args->id != id);
  if ((((__args->fSuccessfullyConnected)._M_base._M_i & 1U) == 0) ||
     (((__args->fDisconnect)._M_base._M_i & 1U) != 0)) {
LAB_0018401f:
    bVar1 = false;
  }
  else {
    bVar1 = std::function<bool_(CNode_*)>::operator()(in_RDX,__args);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::ForNode(NodeId id, std::function<bool(CNode* pnode)> func)
{
    CNode* found = nullptr;
    LOCK(m_nodes_mutex);
    for (auto&& pnode : m_nodes) {
        if(pnode->GetId() == id) {
            found = pnode;
            break;
        }
    }
    return found != nullptr && NodeFullyConnected(found) && func(found);
}